

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O1

char * __thiscall
FailableMemoryAllocator::alloc_memory
          (FailableMemoryAllocator *this,size_t size,char *file,size_t line)

{
  bool bVar1;
  char *pcVar2;
  FailableMemoryAllocator *pFVar3;
  FailableMemoryAllocator *pFVar4;
  char *extraout_RDX;
  char *extraout_RDX_00;
  LocationToFailAllocNode **ppLVar5;
  FailableMemoryAllocator *this_00;
  FailableMemoryAllocator *this_01;
  
  this->currentAllocNumber_ = this->currentAllocNumber_ + 1;
  this_01 = (FailableMemoryAllocator *)this->head_;
  pFVar3 = (FailableMemoryAllocator *)line;
  pcVar2 = file;
  this_00 = this;
  if (this_01 == (FailableMemoryAllocator *)0x0) {
LAB_00237f8f:
    pcVar2 = TestMemoryAllocator::alloc_memory
                       (&this_00->super_TestMemoryAllocator,size,pcVar2,(size_t)pFVar3);
    return pcVar2;
  }
  this_00 = this_01;
  bVar1 = LocationToFailAllocNode::shouldFail
                    ((LocationToFailAllocNode *)this_01,this->currentAllocNumber_,file,line);
  pcVar2 = extraout_RDX;
  if (bVar1) {
    pFVar4 = (FailableMemoryAllocator *)0x0;
  }
  else {
    do {
      pFVar4 = this_01;
      this_01 = (FailableMemoryAllocator *)(pFVar4->super_TestMemoryAllocator).free_name_;
      if (this_01 == (FailableMemoryAllocator *)0x0) goto LAB_00237f8f;
      this_00 = this_01;
      bVar1 = LocationToFailAllocNode::shouldFail
                        ((LocationToFailAllocNode *)this_01,this->currentAllocNumber_,file,line);
      pFVar3 = pFVar4;
      pcVar2 = extraout_RDX_00;
    } while (!bVar1);
  }
  ppLVar5 = (LocationToFailAllocNode **)&(pFVar4->super_TestMemoryAllocator).free_name_;
  if (pFVar4 == (FailableMemoryAllocator *)0x0) {
    ppLVar5 = &this->head_;
  }
  *ppLVar5 = (LocationToFailAllocNode *)(this_01->super_TestMemoryAllocator).free_name_;
  (*(this->super_TestMemoryAllocator)._vptr_TestMemoryAllocator[3])
            (this,this_01,size,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/TestMemoryAllocator.cpp"
             ,0x166);
  return (char *)0x0;
}

Assistant:

char* FailableMemoryAllocator::alloc_memory(size_t size, const char* file, size_t line)
{
    currentAllocNumber_++;
    LocationToFailAllocNode* current = head_;
    LocationToFailAllocNode* previous = NULLPTR;

    while (current) {
      if (current->shouldFail(currentAllocNumber_, file, line)) {
        if (previous) previous->next_ = current->next_;
        else head_ = current->next_;

        free_memory((char*) current, size, __FILE__, __LINE__);
        return NULLPTR;
      }
      previous = current;
      current = current->next_;
    }
    return TestMemoryAllocator::alloc_memory(size, file, line);
}